

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int calc_cookie_signature
              (ptls_t *tls,ptls_handshake_properties_t *properties,
              ptls_key_exchange_algorithm_t *negotiated_group,ptls_iovec_t tbs,uint8_t *sig)

{
  ushort uVar1;
  ptls_hash_algorithm_t *algo;
  ulong uVar2;
  ptls_hash_context_t *ppVar3;
  size_t sVar4;
  int iVar5;
  uint8_t len8_3;
  uint8_t len8_2;
  uint8_t len8_1;
  uint8_t len8;
  uint8_t b_1 [2];
  uint8_t b [2];
  
  algo = (*tls->ctx->cipher_suites)->hash;
  ppVar3 = ptls_hmac_create(algo,(properties->field_0).server.cookie.key,algo->digest_size);
  if (ppVar3 == (ptls_hash_context_t *)0x0) {
    iVar5 = 0x201;
  }
  else {
    len8 = ' ';
    (*ppVar3->update)(ppVar3,&len8,1);
    (*ppVar3->update)(ppVar3,tls->client_random,0x20);
    if (tls->server_name == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar4 = strlen(tls->server_name);
      if (0xfe < sVar4) {
        __assert_fail("len < UINT8_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                      ,0x99c,
                      "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                     );
      }
    }
    len8_1 = (uint8_t)sVar4;
    (*ppVar3->update)(ppVar3,&len8_1,1);
    (*ppVar3->update)(ppVar3,tls->server_name,sVar4);
    uVar1 = tls->cipher_suite->id;
    b = (uint8_t  [2])(uVar1 << 8 | uVar1 >> 8);
    (*ppVar3->update)(ppVar3,b,2);
    b_1 = (uint8_t  [2])(negotiated_group->id << 8 | negotiated_group->id >> 8);
    (*ppVar3->update)(ppVar3,b_1,2);
    uVar2 = (properties->field_0).server.cookie.additional_data.len;
    if (0xfe < uVar2) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                    ,0x99f,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    len8_2 = (uint8_t)uVar2;
    (*ppVar3->update)(ppVar3,&len8_2,1);
    (*ppVar3->update)(ppVar3,(properties->field_0).server.cookie.additional_data.base,uVar2);
    if (0xfe < tbs.len) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                    ,0x9a1,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    len8_3 = (uint8_t)tbs.len;
    (*ppVar3->update)(ppVar3,&len8_3,1);
    (*ppVar3->update)(ppVar3,tbs.base,tbs.len);
    iVar5 = 0;
    (*ppVar3->final)(ppVar3,sig,PTLS_HASH_FINAL_MODE_FREE);
  }
  return iVar5;
}

Assistant:

static int calc_cookie_signature(ptls_t *tls, ptls_handshake_properties_t *properties,
                                 ptls_key_exchange_algorithm_t *negotiated_group, ptls_iovec_t tbs, uint8_t *sig)
{
    ptls_hash_algorithm_t *algo = tls->ctx->cipher_suites[0]->hash;
    ptls_hash_context_t *hctx;

    if ((hctx = ptls_hmac_create(algo, properties->server.cookie.key, algo->digest_size)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

#define UPDATE_BLOCK(p, _len)                                                                                                      \
    do {                                                                                                                           \
        size_t len = (_len);                                                                                                       \
        assert(len < UINT8_MAX);                                                                                                   \
        uint8_t len8 = (uint8_t)len;                                                                                               \
        hctx->update(hctx, &len8, 1);                                                                                              \
        hctx->update(hctx, (p), len);                                                                                              \
    } while (0)
#define UPDATE16(_v)                                                                                                               \
    do {                                                                                                                           \
        uint16_t v = (_v);                                                                                                         \
        uint8_t b[2] = {v >> 8, v & 0xff};                                                                                         \
        hctx->update(hctx, b, 2);                                                                                                  \
    } while (0)

    UPDATE_BLOCK(tls->client_random, sizeof(tls->client_random));
    UPDATE_BLOCK(tls->server_name, tls->server_name != NULL ? strlen(tls->server_name) : 0);
    UPDATE16(tls->cipher_suite->id);
    UPDATE16(negotiated_group->id);
    UPDATE_BLOCK(properties->server.cookie.additional_data.base, properties->server.cookie.additional_data.len);

    UPDATE_BLOCK(tbs.base, tbs.len);

#undef UPDATE_BLOCK
#undef UPDATE16

    hctx->final(hctx, sig, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}